

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O2

bool __thiscall SkeletalMesh::Material::setDiffuse(Material *this,string *_name,string *_filename)

{
  Texture *pTVar1;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)_name);
  std::__cxx11::string::string((string *)&local_50,(string *)_filename);
  pTVar1 = TextureImage::Texture::loadTexture(&local_30,&local_50);
  this->diffuse = pTVar1;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return pTVar1 != (Texture *)TextureImage::Texture::error;
}

Assistant:

bool setDiffuse(std::string _name, std::string _filename = std::string()) {
            return (diffuse = &TextureImage::Texture::loadTexture(_name, _filename))
                   != &TextureImage::Texture::error;
        }